

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O0

string * (anonymous_namespace)::GetSystemTempDir_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  char *local_18;
  char *tempdir;
  
  __s = getenv("TMPDIR");
  local_18 = __s;
  if (__s == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"/tmp",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return in_RDI;
}

Assistant:

string GetSystemTempDir() {
#ifdef _WIN32
  char buf[1024];
  if (!GetTempPath(sizeof(buf), buf))
    return "";
  return buf;
#else
  const char* tempdir = getenv("TMPDIR");
  if (tempdir)
    return tempdir;
  return "/tmp";
#endif
}